

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O2

void __thiscall
glslang::TSampler::set(TSampler *this,TBasicType t,TSamplerDim d,bool a,bool s,bool m)

{
  undefined7 in_register_00000009;
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  
  *this = (TSampler)
          (((uint)*this & 0x80000000) +
           ((int)CONCAT71(in_register_00000089,m) << 0x12 |
           (int)CONCAT71(in_register_00000081,s) << 0x11 |
           (int)CONCAT71(in_register_00000009,a) << 0x10 | (d & 0xff) << 8 | t & 0xff) + 0x1f100000)
  ;
  return;
}

Assistant:

void set(TBasicType t, TSamplerDim d, bool a = false, bool s = false, bool m = false)
    {
        clear();
        type = t;
        dim = d;
        arrayed = a;
        shadow = s;
        ms = m;
        combined = true;
    }